

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLatch.c
# Opt level: O3

int Abc_NtkLatchIsSelfFeed(Abc_Obj_t *pLatch)

{
  Abc_Obj_t *pAVar1;
  long *plVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  
  if ((*(uint *)&pLatch->field_0x14 & 0xf) != 8) {
    __assert_fail("Abc_ObjIsLatch(pLatch)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcLatch.c"
                  ,0x4a,"int Abc_NtkLatchIsSelfFeed(Abc_Obj_t *)");
  }
  plVar2 = (long *)pLatch->pNtk->vObjs->pArray[*(pLatch->vFanins).pArray];
  plVar2 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
  if (((*(uint *)((long)plVar2 + 0x14) & 0xf) != 5) ||
     (pAVar4 = *(Abc_Obj_t **)
                (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8),
     (*(uint *)&pAVar4->field_0x14 & 0xf) != 8)) {
    return 0;
  }
  uVar3 = *(uint *)&pAVar4->field_0x14;
  do {
    if ((uVar3 & 0xf) != 8) {
      __assert_fail("Abc_ObjIsLatch(pLatch)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcLatch.c"
                    ,0x33,"int Abc_NtkLatchIsSelfFeed_rec(Abc_Obj_t *, Abc_Obj_t *)");
    }
    if (pAVar4 == pLatch) {
      return 1;
    }
    plVar2 = (long *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray];
    plVar2 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
    if ((*(uint *)((long)plVar2 + 0x14) & 0xf) != 5) {
      return 0;
    }
    pAVar1 = *(Abc_Obj_t **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8)
    ;
    uVar3 = *(uint *)&pAVar1->field_0x14;
    pLatch = pAVar4;
    pAVar4 = pAVar1;
  } while ((uVar3 & 0xf) == 8);
  return 0;
}

Assistant:

int Abc_NtkLatchIsSelfFeed( Abc_Obj_t * pLatch )
{
    Abc_Obj_t * pFanin;
    assert( Abc_ObjIsLatch(pLatch) );
    pFanin = Abc_ObjFanin0(Abc_ObjFanin0(pLatch));
    if ( !Abc_ObjIsBo(pFanin) || !Abc_ObjIsLatch(Abc_ObjFanin0(pFanin)) )
        return 0;
    return Abc_NtkLatchIsSelfFeed_rec( Abc_ObjFanin0(pFanin), pLatch );
}